

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS
ref_cell_id_list_around_both
          (REF_CELL ref_cell_a,REF_CELL ref_cell_b,REF_INT node,REF_INT max_ids,REF_INT *n_ids,
          REF_INT *ids)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  *n_ids = 0;
  if (node < 0) {
    return 0;
  }
  pRVar1 = ref_cell_a->ref_adj;
  uVar7 = 0;
  if ((node < pRVar1->nnode) && (lVar8 = (long)pRVar1->first[(uint)node], lVar8 != -1)) {
    uVar4 = ref_cell_nodes(ref_cell_a,pRVar1->item[lVar8].ref,local_a8);
    if (uVar4 == 0) {
      uVar7 = 0;
      do {
        if ((int)uVar7 < 1) {
LAB_0011d004:
          if (max_ids <= (int)uVar7) {
            return 7;
          }
          ids[(int)uVar7] = local_a8[ref_cell_a->node_per];
          uVar7 = *n_ids + 1;
          *n_ids = uVar7;
        }
        else {
          uVar6 = 0;
          bVar3 = false;
          do {
            if (local_a8[ref_cell_a->node_per] == ids[uVar6]) {
              bVar3 = true;
            }
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
          if (!bVar3) goto LAB_0011d004;
        }
        pRVar2 = ref_cell_a->ref_adj->item;
        lVar8 = (long)pRVar2[(int)lVar8].next;
        if (lVar8 == -1) {
          if (node < 0) {
            return 0;
          }
          goto LAB_0011d05b;
        }
        uVar4 = ref_cell_nodes(ref_cell_a,pRVar2[lVar8].ref,local_a8);
      } while (uVar4 == 0);
    }
    uVar5 = 0x51a;
  }
  else {
LAB_0011d05b:
    pRVar1 = ref_cell_b->ref_adj;
    if (pRVar1->nnode <= node) {
      return 0;
    }
    lVar8 = (long)pRVar1->first[(uint)node];
    if (lVar8 == -1) {
      return 0;
    }
    uVar4 = ref_cell_nodes(ref_cell_b,pRVar1->item[lVar8].ref,local_a8);
    while (uVar4 == 0) {
      if ((int)uVar7 < 1) {
LAB_0011d106:
        if (max_ids <= (int)uVar7) {
          return 7;
        }
        ids[(int)uVar7] = local_a8[ref_cell_b->node_per];
        uVar7 = *n_ids + 1;
        *n_ids = uVar7;
      }
      else {
        uVar6 = 0;
        bVar3 = false;
        do {
          if (local_a8[ref_cell_b->node_per] == ids[uVar6]) {
            bVar3 = true;
          }
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
        if (!bVar3) goto LAB_0011d106;
      }
      pRVar2 = ref_cell_b->ref_adj->item;
      lVar8 = (long)pRVar2[(int)lVar8].next;
      if (lVar8 == -1) {
        return 0;
      }
      uVar4 = ref_cell_nodes(ref_cell_b,pRVar2[lVar8].ref,local_a8);
    }
    uVar5 = 0x52a;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar5,
         "ref_cell_id_list_around_both",(ulong)uVar4,"nodes");
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_list_around_both(REF_CELL ref_cell_a,
                                                REF_CELL ref_cell_b,
                                                REF_INT node, REF_INT max_ids,
                                                REF_INT *n_ids, REF_INT *ids) {
  REF_INT item, cell, id, deg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL already_have_it;
  REF_CELL ref_cell;

  *n_ids = 0;

  ref_cell = ref_cell_a;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  ref_cell = ref_cell_b;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  return REF_SUCCESS;
}